

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  sockaddr_in bind_addr_local;
  
  bind_addr_local.sin_zero = bind_addr.sin_zero;
  bind_addr_local._0_8_ = bind_addr._0_8_;
  __fd = socket(2,1,0);
  eval_a = (int64_t)__fd;
  if (eval_a < 0) {
    pcVar3 = ">=";
    pcVar2 = "sock";
    uVar4 = 0x70;
  }
  else {
    yes = 1;
    iVar1 = setsockopt(__fd,1,2,&yes,4);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = bind(__fd,(sockaddr *)&bind_addr_local,0x10);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        return __fd;
      }
      pcVar3 = "==";
      pcVar2 = "r";
      uVar4 = 0x7d;
    }
    else {
      pcVar3 = "==";
      pcVar2 = "r";
      uVar4 = 0x78;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
          ,uVar4,pcVar2,pcVar3,"0",eval_a,pcVar3,0);
  abort();
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT_OK(r);

  return sock;
}